

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpOperations.cpp
# Opt level: O0

pointer gmlc::networking::establishConnection
                  (SocketFactory *sf,io_context *io_context,string *host,string *port,
                  milliseconds timeOut)

{
  bool bVar1;
  strong_ordering sVar2;
  milliseconds __rtime;
  type sf_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  rep in_R9;
  pointer pVar4;
  time_point tock;
  int trycnt;
  milliseconds timeRemPrev;
  milliseconds timeRemaining;
  time_point tick;
  pointer *connectionPtr;
  shared_ptr<gmlc::networking::TcpConnection> *in_stack_fffffffffffffe38;
  milliseconds in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  strong_ordering in_stack_fffffffffffffe4f;
  milliseconds in_stack_fffffffffffffe50;
  milliseconds in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  strong_ordering in_stack_fffffffffffffe67;
  milliseconds in_stack_fffffffffffffe68;
  bool local_182;
  __unspec local_121;
  rep local_120;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  milliseconds in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  io_context *in_stack_ffffffffffffff00;
  milliseconds io_context_00;
  SocketFactory *in_stack_ffffffffffffff08;
  __unspec local_d1;
  rep local_d0;
  type local_c1;
  rep local_c0;
  rep local_b8;
  rep local_b0;
  rep local_a8;
  undefined8 local_a0;
  rep local_98;
  int local_8c;
  rep local_88;
  rep local_80;
  undefined8 local_78;
  __unspec local_65;
  int local_64;
  duration<long,std::ratio<1l,1000l>> local_60 [11];
  type local_55;
  undefined1 local_31;
  rep local_10;
  
  local_31 = 0;
  local_10 = in_R9;
  std::shared_ptr<gmlc::networking::TcpConnection>::shared_ptr
            ((shared_ptr<gmlc::networking::TcpConnection> *)0x6f3f74);
  TcpConnection::create
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (string *)in_stack_fffffffffffffef0.__r,
             CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  std::shared_ptr<gmlc::networking::TcpConnection>::operator=
            ((shared_ptr<gmlc::networking::TcpConnection> *)in_stack_fffffffffffffe40.__r,
             in_stack_fffffffffffffe38);
  std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
            ((shared_ptr<gmlc::networking::TcpConnection> *)0x6f3fca);
  local_64 = 0;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_60,&local_64);
  local_55 = (type)std::chrono::
                   operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                             ((duration<long,_std::ratio<1L,_1000L>_> *)
                              in_stack_fffffffffffffe68.__r,
                              (duration<long,_std::ratio<1L,_1000L>_> *)
                              CONCAT17(in_stack_fffffffffffffe67._M_value,in_stack_fffffffffffffe60)
                             );
  CLI::std::__cmp_cat::__unspec::__unspec(&local_65,(__unspec *)0x0);
  bVar1 = std::operator<=(local_55);
  _Var3._M_pi = extraout_RDX;
  if (!bVar1) {
    local_78 = std::chrono::_V2::steady_clock::now();
    local_80 = local_10;
    local_88 = local_10;
    local_8c = 1;
    while( true ) {
      std::
      __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x6f40b3);
      local_98 = local_80;
      bVar1 = TcpConnection::waitUntilConnected
                        ((TcpConnection *)in_stack_fffffffffffffe50.__r,in_stack_fffffffffffffe58);
      _Var3._M_pi = extraout_RDX_00;
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_a0 = std::chrono::_V2::steady_clock::now();
      local_b0 = local_10;
      local_c0 = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffe4f._M_value,
                                             in_stack_fffffffffffffe48),
                                 in_stack_fffffffffffffe40.__r);
      local_b8 = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                 in_stack_fffffffffffffe38);
      local_a8 = (rep)std::chrono::operator-
                                (in_stack_fffffffffffffe58.__r,in_stack_fffffffffffffe50.__r);
      local_80 = local_a8;
      __rtime = ms<(char)48>();
      local_d0 = __rtime.__r;
      local_c1 = (type)std::chrono::
                       operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                                 ((duration<long,_std::ratio<1L,_1000L>_> *)
                                  in_stack_fffffffffffffe68.__r,
                                  (duration<long,_std::ratio<1L,_1000L>_> *)
                                  CONCAT17(in_stack_fffffffffffffe67._M_value,
                                           in_stack_fffffffffffffe60));
      CLI::std::__cmp_cat::__unspec::__unspec(&local_d1,(__unspec *)0x0);
      local_182 = CLI::std::operator<(local_c1);
      local_182 = local_182 && 1 < local_8c;
      if (local_182) {
        std::shared_ptr<gmlc::networking::TcpConnection>::shared_ptr
                  ((shared_ptr<gmlc::networking::TcpConnection> *)in_stack_fffffffffffffe40.__r,
                   in_stack_fffffffffffffe38);
        std::shared_ptr<gmlc::networking::TcpConnection>::operator=
                  ((shared_ptr<gmlc::networking::TcpConnection> *)in_stack_fffffffffffffe40.__r,
                   in_stack_fffffffffffffe38);
        std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
                  ((shared_ptr<gmlc::networking::TcpConnection> *)0x6f423d);
        _Var3._M_pi = extraout_RDX_01;
        break;
      }
      sf_00 = std::chrono::operator-(in_stack_fffffffffffffe58.__r,in_stack_fffffffffffffe50.__r);
      in_stack_fffffffffffffe68 = ms<(char)49,(char)48,(char)48>();
      io_context_00 = in_stack_fffffffffffffe68;
      sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                        ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffe68.__r,
                         (duration<long,_std::ratio<1L,_1000L>_> *)
                         CONCAT17(in_stack_fffffffffffffe67._M_value,in_stack_fffffffffffffe60));
      in_stack_fffffffffffffe67 = sVar2;
      CLI::std::__cmp_cat::__unspec::__unspec((__unspec *)&stack0xfffffffffffffeff,(__unspec *)0x0);
      bVar1 = CLI::std::operator<(sVar2._M_value);
      if (bVar1) {
        in_stack_fffffffffffffe58 = ms<(char)50,(char)48,(char)48>();
        in_stack_fffffffffffffef0 = in_stack_fffffffffffffe58;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)__rtime.__r);
      }
      local_88 = local_80;
      in_stack_fffffffffffffe50 = ms<(char)48>();
      local_120 = in_stack_fffffffffffffe50.__r;
      in_stack_fffffffffffffe4f =
           std::chrono::operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                     ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffe68.__r,
                      (duration<long,_std::ratio<1L,_1000L>_> *)
                      CONCAT17(in_stack_fffffffffffffe67._M_value,in_stack_fffffffffffffe60));
      sVar2 = in_stack_fffffffffffffe4f;
      CLI::std::__cmp_cat::__unspec::__unspec(&local_121,(__unspec *)0x0);
      bVar1 = CLI::std::operator<(sVar2._M_value);
      if (bVar1) {
        in_stack_fffffffffffffe40 = ms<(char)52,(char)48,(char)48>();
        local_80 = in_stack_fffffffffffffe40.__r;
      }
      local_8c = local_8c + 1;
      TcpConnection::create
                ((SocketFactory *)sf_00.__r,(io_context *)io_context_00.__r,
                 in_stack_fffffffffffffef8,(string *)in_stack_fffffffffffffef0.__r,
                 CONCAT17(sVar2._M_value,in_stack_fffffffffffffee8));
      std::shared_ptr<gmlc::networking::TcpConnection>::operator=
                ((shared_ptr<gmlc::networking::TcpConnection> *)in_stack_fffffffffffffe40.__r,
                 in_stack_fffffffffffffe38);
      std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
                ((shared_ptr<gmlc::networking::TcpConnection> *)0x6f43f8);
    }
  }
  pVar4.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  pVar4.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (pointer)pVar4.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpConnection::pointer establishConnection(
    const SocketFactory& sf,
    asio::io_context& io_context,
    const std::string& host,
    const std::string& port,
    std::chrono::milliseconds timeOut)
{
    using std::chrono::milliseconds;
    using std::chrono::steady_clock;

    using namespace std::chrono_literals;  // NOLINT

    TcpConnection::pointer connectionPtr;
    connectionPtr = TcpConnection::create(sf, io_context, host, port);
    if (timeOut <= std::chrono::milliseconds(0)) {
        return connectionPtr;
    }

    auto tick = steady_clock::now();
    milliseconds timeRemaining(timeOut);
    milliseconds timeRemPrev(timeOut);
    int trycnt = 1;
    while (!connectionPtr->waitUntilConnected(timeRemaining)) {
        auto tock = steady_clock::now();
        timeRemaining = milliseconds(timeOut) -
            std::chrono::duration_cast<milliseconds>(tock - tick);
        if ((timeRemaining < 0ms) && (trycnt > 1)) {
            connectionPtr = nullptr;
            break;
        }
        // make sure we slow down and sleep for a little bit
        if (timeRemPrev - timeRemaining < 100ms) {
            std::this_thread::sleep_for(200ms);
        }
        timeRemPrev = timeRemaining;
        if (timeRemaining < 0ms) {
            timeRemaining = 400ms;
        }

        // lets try to connect again
        ++trycnt;
        connectionPtr = TcpConnection::create(sf, io_context, host, port);
    }
    return connectionPtr;
}